

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O0

InterchangeObject * ASDCP::MXF::CreateObject(Dictionary *Dict,UL *label)

{
  bool bVar1;
  pointer ppVar2;
  _Self local_48;
  _Self local_40;
  FLi_t i;
  AutoMutex local_28;
  AutoMutex BlockLock;
  UL *label_local;
  Dictionary *Dict_local;
  
  BlockLock.m_Mutex = (Mutex *)label;
  if (!s_TypesInit) {
    Kumu::AutoMutex::AutoMutex(&local_28,&s_InitLock);
    if ((s_TypesInit & 1U) == 0) {
      Metadata_InitTypes(Dict);
      s_TypesInit = true;
    }
    Kumu::AutoMutex::~AutoMutex(&local_28);
  }
  local_40._M_node =
       (_Base_ptr)
       std::
       map<ASDCP::UL,_ASDCP::MXF::InterchangeObject_*(*)(const_ASDCP::Dictionary_*),_ASDCP::MXF::FactoryCompareUL,_std::allocator<std::pair<const_ASDCP::UL,_ASDCP::MXF::InterchangeObject_*(*)(const_ASDCP::Dictionary_*)>_>_>
       ::find(&s_FactoryList.super_FactoryMap_t,(key_type *)BlockLock.m_Mutex);
  local_48._M_node =
       (_Base_ptr)
       std::
       map<ASDCP::UL,_ASDCP::MXF::InterchangeObject_*(*)(const_ASDCP::Dictionary_*),_ASDCP::MXF::FactoryCompareUL,_std::allocator<std::pair<const_ASDCP::UL,_ASDCP::MXF::InterchangeObject_*(*)(const_ASDCP::Dictionary_*)>_>_>
       ::end(&s_FactoryList.super_FactoryMap_t);
  bVar1 = std::operator==(&local_40,&local_48);
  if (bVar1) {
    Dict_local = (Dictionary *)operator_new(0xa0);
    InterchangeObject::InterchangeObject((InterchangeObject *)Dict_local,Dict);
  }
  else {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_ASDCP::UL,_ASDCP::MXF::InterchangeObject_*(*)(const_ASDCP::Dictionary_*)>_>
             ::operator->(&local_40);
    Dict_local = (Dictionary *)(*ppVar2->second)(Dict);
  }
  return (InterchangeObject *)Dict_local;
}

Assistant:

ASDCP::MXF::InterchangeObject*
ASDCP::MXF::CreateObject(const Dictionary* Dict, const UL& label)
{
  if ( ! s_TypesInit )
    {
      Kumu::AutoMutex BlockLock(s_InitLock);

      if ( ! s_TypesInit )
	{
	  MXF::Metadata_InitTypes(Dict);
	  s_TypesInit = true;
	}
    }

  FLi_t i = s_FactoryList.find(label);

  if ( i == s_FactoryList.end() )
    return new InterchangeObject(Dict);

  return i->second(Dict);
}